

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData256 * cfd::core::HashUtil::Sha256(ByteData256 *__return_storage_ptr__,Pubkey *pubkey)

{
  ByteData *__return_storage_ptr___00;
  ByteData local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  Pubkey *local_18;
  Pubkey *pubkey_local;
  
  __return_storage_ptr___00 = &local_48;
  local_18 = pubkey;
  pubkey_local = (Pubkey *)__return_storage_ptr__;
  Pubkey::GetData(__return_storage_ptr___00,pubkey);
  ByteData::GetBytes(&local_30,__return_storage_ptr___00);
  Sha256(__return_storage_ptr__,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            (&__return_storage_ptr___00->data_);
  ByteData::~ByteData((ByteData *)0x40849c);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 HashUtil::Sha256(const Pubkey &pubkey) {
  return Sha256(pubkey.GetData().GetBytes());
}